

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> * __thiscall
neueda::cdr::findAll(cdr *this,cdrKey_t *key)

{
  vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *in_RDX;
  cdrKey_t *in_RSI;
  orderedItemMap *in_RDI;
  cdr *unaff_retaddr;
  vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *found;
  orderedItemMap *items;
  
  items = in_RDI;
  std::vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>::vector
            ((vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *)0x1149a3);
  findInChildren(unaff_retaddr,items,in_RSI,in_RDX);
  return (vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *)in_RDI;
}

Assistant:

vector<const cdrItem*>
cdr::findAll (const cdrKey_t& key) const
{
    vector<const cdrItem*> found;
    findInChildren (&mOrdered, key, found);
    return found;
}